

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void clear_buckets(ecs_map_t *map)

{
  undefined8 *puVar1;
  int iVar2;
  ecs_bucket_t *peVar3;
  long lVar4;
  
  peVar3 = map->buckets;
  iVar2 = map->bucket_count;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      (*ecs_os_api.free_)(*(void **)((long)&peVar3->keys + lVar4));
      (*ecs_os_api.free_)(*(void **)((long)&peVar3->payload + lVar4));
      puVar1 = (undefined8 *)((long)&peVar3->keys + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&peVar3->count + lVar4) = 0;
      lVar4 = lVar4 + 0x18;
    } while ((long)iVar2 * 0x18 != lVar4);
  }
  (*ecs_os_api.free_)(peVar3);
  map->buckets = (ecs_bucket_t *)0x0;
  map->bucket_count = 0;
  return;
}

Assistant:

static
void clear_buckets(
    ecs_map_t *map)
{
    ecs_bucket_t *buckets = map->buckets;
    int32_t i, count = map->bucket_count;
    for (i = 0; i < count; i ++) {
        clear_bucket(&buckets[i]);
    }
    ecs_os_free(buckets);
    map->buckets = NULL;
    map->bucket_count = 0;
}